

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rotation.cpp
# Opt level: O0

void __thiscall Rotation::transform(Rotation *this,TransformationData *transformationData)

{
  bool bVar1;
  vector<Quad_*,_std::allocator<Quad_*>_> *this_00;
  vector<Quad_*,_std::allocator<Quad_*>_> *this_01;
  reference ppQVar2;
  TransformationData *pTVar3;
  float extraout_XMM0_Da;
  float fVar4;
  Quad *local_48;
  Quad *local_40;
  Quad *quad;
  iterator __end1;
  iterator __begin1;
  vector<Quad_*,_std::allocator<Quad_*>_> *__range1;
  vector<Quad_*,_std::allocator<Quad_*>_> *transformedQuads;
  TransformationData *transformationData_local;
  Rotation *this_local;
  
  pTVar3 = transformationData;
  bVar1 = TransformationData::isTwoState(transformationData);
  if (bVar1) {
    std::abs((int)pTVar3);
    this->angleDegrees = extraout_XMM0_Da;
    this->angleRadians = (this->angleDegrees * 3.1415927) / 180.0;
  }
  this_00 = (vector<Quad_*,_std::allocator<Quad_*>_> *)operator_new(0x18);
  memset(this_00,0,0x18);
  std::vector<Quad_*,_std::allocator<Quad_*>_>::vector(this_00);
  this_01 = TransformationData::getWorkingQuads(transformationData);
  __end1 = std::vector<Quad_*,_std::allocator<Quad_*>_>::begin(this_01);
  quad = (Quad *)std::vector<Quad_*,_std::allocator<Quad_*>_>::end(this_01);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Quad_**,_std::vector<Quad_*,_std::allocator<Quad_*>_>_>
                                     *)&quad), bVar1) {
    ppQVar2 = __gnu_cxx::__normal_iterator<Quad_**,_std::vector<Quad_*,_std::allocator<Quad_*>_>_>::
              operator*(&__end1);
    local_40 = *ppQVar2;
    local_48 = Quad::getRotatedQuad(local_40,this->pivotPoint,this->angleRadians);
    std::vector<Quad_*,_std::allocator<Quad_*>_>::push_back(this_00,&local_48);
    __gnu_cxx::__normal_iterator<Quad_**,_std::vector<Quad_*,_std::allocator<Quad_*>_>_>::operator++
              (&__end1);
  }
  TransformationData::rollforward(transformationData);
  TransformationData::setWorkingQuads(transformationData,this_00);
  fVar4 = TransformationData::getWorkingRotation(transformationData);
  TransformationData::setWorkingRotation(transformationData,fVar4 + this->angleDegrees);
  return;
}

Assistant:

void Rotation::transform(TransformationData& transformationData) {
    if (transformationData.isTwoState()) {
        angleDegrees = abs(angleDegrees);
        angleRadians = angleDegrees * M_PI / 180;
    }
    
    vector<Quad*>* transformedQuads = new vector<Quad*>();
    for (auto quad : *transformationData.getWorkingQuads()) {
        transformedQuads->push_back(quad->getRotatedQuad(pivotPoint, angleRadians));
    }

    transformationData.rollforward();
    transformationData.setWorkingQuads(transformedQuads);
    transformationData.setWorkingRotation(transformationData.getWorkingRotation() + angleDegrees);
}